

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O1

Vec_Ptr_t * Bac_NtkTransformToPtrBox(Bac_Ntk_t *p,int iBox)

{
  uint uVar1;
  uint uVar2;
  Bac_Man_t *pBVar3;
  Mio_Library_t *pLib;
  int iVar4;
  char *pcVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  int iVar8;
  ulong uVar9;
  Bac_Ntk_t *p_00;
  ulong uVar10;
  byte *pbVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  byte local_64;
  Mio_Gate_t *local_50;
  
  if ((-1 < iBox) && (iBox < (p->vType).nSize)) {
    uVar9 = (ulong)(uint)iBox;
    local_64 = (p->vType).pArray[uVar9];
    if ((local_64 >> 1) - 0x49 < 0xffffffbc) {
      __assert_fail("Bac_ObjIsBox(p, i)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                    ,0x13d,"int Bac_BoxNtkId(Bac_Ntk_t *, int)");
    }
    if (iBox < (p->vFanin).nSize) {
      pBVar3 = p->pDesign;
      iVar16 = (p->vFanin).pArray[uVar9];
      if (((long)iVar16 < 1) || (pBVar3->nNtks < iVar16)) {
        p_00 = (Bac_Ntk_t *)0x0;
      }
      else {
        p_00 = pBVar3->pNtks + iVar16;
      }
      pLib = (Mio_Library_t *)pBVar3->pMioLib;
      if (pLib == (Mio_Library_t *)0x0) {
        local_50 = (Mio_Gate_t *)0x0;
      }
      else {
        pcVar5 = Abc_NamStr(pBVar3->pMods,iVar16);
        local_50 = Mio_LibraryReadGateByName(pLib,pcVar5,(char *)0x0);
      }
      iVar16 = (p->vType).nSize;
      if (iVar16 <= iBox) goto LAB_00394944;
      pcVar5 = (p->vType).pArray;
      if (((byte)pcVar5[uVar9] >> 1) - 0x49 < 0xffffffbc) {
        __assert_fail("Bac_ObjIsBox(p, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                      ,0x130,"int Bac_BoxBiNum(Bac_Ntk_t *, int)");
      }
      local_64 = local_64 & 0xfe;
      uVar10 = uVar9;
      do {
        if ((long)uVar10 < 1) {
          iVar8 = 1;
          goto LAB_0039447e;
        }
        if (iVar16 < iBox) goto LAB_00394944;
        lVar14 = uVar10 - 1;
        uVar10 = uVar10 - 1;
      } while ((pcVar5[lVar14] & 0xfeU) == 6);
      iVar8 = -(int)uVar10;
LAB_0039447e:
      pbVar11 = (byte *)(pcVar5 + uVar9);
      iVar4 = iBox + -1;
      do {
        pbVar11 = pbVar11 + 1;
        iVar12 = iVar16 + -1;
        if (iVar16 <= iVar4 + 2) break;
        iVar12 = iVar4 + 1;
        iVar4 = iVar12;
      } while ((*pbVar11 & 0xfe) == 8);
      iVar12 = iVar12 + iVar8;
      if (iVar12 < 0) {
        __assert_fail("nCap >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,99,"Vec_Ptr_t *Vec_PtrAllocExact(int)");
      }
      pVVar6 = (Vec_Ptr_t *)malloc(0x10);
      pVVar6->nSize = 0;
      pVVar6->nCap = iVar12 * 2;
      if (iVar12 == 0) {
        ppvVar7 = (void **)0x0;
      }
      else {
        ppvVar7 = (void **)malloc((ulong)(uint)(iVar12 * 2) << 3);
      }
      pVVar6->pArray = ppvVar7;
      if (iBox < (p->vFanin).nSize) {
        pcVar5 = Abc_NamStr(p->pDesign->pMods,(p->vFanin).pArray[uVar9]);
        if (iVar12 == 0) {
          if (ppvVar7 == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(ppvVar7,0x80);
          }
          pVVar6->pArray = ppvVar7;
          pVVar6->nCap = 0x10;
        }
        ppvVar7 = pVVar6->pArray;
        pVVar6->nSize = 1;
        *ppvVar7 = pcVar5;
        pcVar5 = Bac_ObjNameStr(p,iBox);
        if (pVVar6->nCap == 1) {
          ppvVar7 = (void **)realloc(ppvVar7,0x80);
          pVVar6->pArray = ppvVar7;
          pVVar6->nCap = 0x10;
        }
        pVVar6->nSize = 2;
        pVVar6->pArray[1] = pcVar5;
        if (iBox != 0) {
          uVar10 = 1;
          if (1 < iBox) {
            uVar10 = (ulong)(uint)iBox;
          }
          uVar15 = 0;
          uVar13 = uVar9;
          do {
            if ((p->vType).nSize < (int)uVar13) goto LAB_00394944;
            uVar13 = uVar13 - 1;
            if (((p->vType).pArray[uVar13 & 0xffffffff] & 0xfeU) != 6) break;
            if (local_64 == 10) {
              if ((long)(p_00->vInputs).nSize <= (long)uVar15) goto LAB_00394963;
              pcVar5 = Bac_ObjNameStr(p_00,(p_00->vInputs).pArray[uVar15]);
            }
            else {
              pcVar5 = Mio_GateReadPinName(local_50,(int)uVar15);
            }
            uVar1 = pVVar6->nSize;
            uVar2 = pVVar6->nCap;
            if (uVar1 == uVar2) {
              if ((int)uVar2 < 0x10) {
                if (pVVar6->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc(0x80);
                }
                else {
                  ppvVar7 = (void **)realloc(pVVar6->pArray,0x80);
                }
                iVar16 = 0x10;
              }
              else {
                iVar16 = uVar2 * 2;
                if (iVar16 <= (int)uVar2) goto LAB_0039468f;
                if (pVVar6->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc((ulong)uVar2 << 4);
                }
                else {
                  ppvVar7 = (void **)realloc(pVVar6->pArray,(ulong)uVar2 << 4);
                }
              }
              pVVar6->pArray = ppvVar7;
              pVVar6->nCap = iVar16;
            }
LAB_0039468f:
            ppvVar7 = pVVar6->pArray;
            pVVar6->nSize = uVar1 + 1;
            ppvVar7[(int)uVar1] = pcVar5;
            pcVar5 = Bac_ObjNameStr(p,(int)uVar13);
            uVar2 = pVVar6->nCap;
            if (uVar1 + 1 == uVar2) {
              if ((int)uVar2 < 0x10) {
                if (ppvVar7 == (void **)0x0) {
                  ppvVar7 = (void **)malloc(0x80);
                }
                else {
                  ppvVar7 = (void **)realloc(ppvVar7,0x80);
                }
                iVar16 = 0x10;
              }
              else {
                iVar16 = uVar2 * 2;
                if (iVar16 <= (int)uVar2) goto LAB_00394729;
                if (ppvVar7 == (void **)0x0) {
                  ppvVar7 = (void **)malloc((ulong)uVar2 << 4);
                }
                else {
                  ppvVar7 = (void **)realloc(ppvVar7,(ulong)uVar2 << 4);
                }
              }
              pVVar6->pArray = ppvVar7;
              pVVar6->nCap = iVar16;
            }
LAB_00394729:
            pVVar6->nSize = uVar1 + 2;
            pVVar6->pArray[(long)(int)uVar1 + 1] = pcVar5;
            uVar15 = uVar15 + 1;
          } while (uVar10 != uVar15);
        }
        if ((int)(uVar9 + 1) < (p->vType).nSize) {
          lVar14 = 0;
          do {
            if (iBox + (int)lVar14 < -1) goto LAB_00394944;
            if (((p->vType).pArray[lVar14 + uVar9 + 1] & 0xfeU) != 8) break;
            if (local_64 == 10) {
              if ((p_00->vOutputs).nSize <= lVar14) goto LAB_00394963;
              pcVar5 = Bac_ObjNameStr(p_00,(p_00->vOutputs).pArray[lVar14]);
            }
            else {
              pcVar5 = Mio_GateReadOutName(local_50);
            }
            uVar1 = pVVar6->nSize;
            uVar2 = pVVar6->nCap;
            if (uVar1 == uVar2) {
              if ((int)uVar2 < 0x10) {
                if (pVVar6->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc(0x80);
                }
                else {
                  ppvVar7 = (void **)realloc(pVVar6->pArray,0x80);
                }
                iVar16 = 0x10;
              }
              else {
                iVar16 = uVar2 * 2;
                if (iVar16 <= (int)uVar2) goto LAB_0039484d;
                if (pVVar6->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc((ulong)uVar2 << 4);
                }
                else {
                  ppvVar7 = (void **)realloc(pVVar6->pArray,(ulong)uVar2 << 4);
                }
              }
              pVVar6->pArray = ppvVar7;
              pVVar6->nCap = iVar16;
            }
LAB_0039484d:
            ppvVar7 = pVVar6->pArray;
            pVVar6->nSize = uVar1 + 1;
            ppvVar7[(int)uVar1] = pcVar5;
            pcVar5 = Bac_ObjNameStr(p,iBox + (int)lVar14 + 1);
            uVar2 = pVVar6->nCap;
            if (uVar1 + 1 == uVar2) {
              if ((int)uVar2 < 0x10) {
                if (ppvVar7 == (void **)0x0) {
                  ppvVar7 = (void **)malloc(0x80);
                }
                else {
                  ppvVar7 = (void **)realloc(ppvVar7,0x80);
                }
                iVar16 = 0x10;
              }
              else {
                iVar16 = uVar2 * 2;
                if (iVar16 <= (int)uVar2) goto LAB_003948dc;
                if (ppvVar7 == (void **)0x0) {
                  ppvVar7 = (void **)malloc((ulong)uVar2 << 4);
                }
                else {
                  ppvVar7 = (void **)realloc(ppvVar7,(ulong)uVar2 << 4);
                }
              }
              pVVar6->pArray = ppvVar7;
              pVVar6->nCap = iVar16;
            }
LAB_003948dc:
            pVVar6->nSize = uVar1 + 2;
            pVVar6->pArray[(long)(int)uVar1 + 1] = pcVar5;
            lVar14 = lVar14 + 1;
          } while (iBox + (int)lVar14 + 1 < (p->vType).nSize);
        }
        if (pVVar6->nSize != pVVar6->nCap) {
          __assert_fail("Vec_PtrSize(vArray) == Vec_PtrCap(vArray)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                        ,0x6b,"int Ptr_CheckArray(Vec_Ptr_t *)");
        }
        return pVVar6;
      }
    }
LAB_00394963:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
LAB_00394944:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

Vec_Ptr_t * Bac_NtkTransformToPtrBox( Bac_Ntk_t * p, int iBox )
{
    int i, iTerm, fUser = Bac_ObjIsBoxUser( p, iBox );
    Bac_Ntk_t * pBoxNtk = Bac_BoxNtk( p, iBox );
    Mio_Library_t * pLib = (Mio_Library_t *)p->pDesign->pMioLib;
    Mio_Gate_t * pGate = pLib ? Mio_LibraryReadGateByName( pLib, Bac_BoxNtkName(p, iBox), NULL ) : NULL;
    Vec_Ptr_t * vBox = Vec_PtrAllocExact( 2*Bac_BoxSize(p, iBox) );
    Vec_PtrPush( vBox, Bac_BoxNtkName(p, iBox) );
    Vec_PtrPush( vBox, Bac_ObjNameStr(p, iBox) );
    Bac_BoxForEachBi( p, iBox, iTerm, i )
    {
        Vec_PtrPush( vBox, fUser ? Bac_ObjNameStr(pBoxNtk, Bac_NtkPi(pBoxNtk, i)) : Mio_GateReadPinName(pGate, i) );
        Vec_PtrPush( vBox, Bac_ObjNameStr(p, iTerm) );
    }
    Bac_BoxForEachBo( p, iBox, iTerm, i )
    {
        Vec_PtrPush( vBox, fUser ? Bac_ObjNameStr(pBoxNtk, Bac_NtkPo(pBoxNtk, i)) : Mio_GateReadOutName(pGate) );
        Vec_PtrPush( vBox, Bac_ObjNameStr(p, iTerm) );
    }
    assert( Ptr_CheckArray(vBox) );
    return vBox;
}